

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<arg_res_tuple<float,_1UL>_>::populate
          (Generators<arg_res_tuple<float,_1UL>_> *this,arg_res_tuple<float,_1UL> *val)

{
  arg_res_tuple<float,_1UL> *in_stack_00000008;
  GeneratorWrapper<arg_res_tuple<float,_1UL>_> *in_stack_ffffffffffffffd8;
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,_1UL>_>,_std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,_1UL>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<arg_res_tuple<float,1ul>>(in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<arg_res_tuple<float,_1UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<float,_1UL>_> *)0x3b15e9);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }